

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_renderer.cpp
# Opt level: O1

string * __thiscall
duckdb::BoxRenderer::ToString
          (string *__return_storage_ptr__,BoxRenderer *this,ClientContext *context,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names,ColumnDataCollection *result)

{
  StringResultRenderer ss;
  BaseResultRenderer local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  local_70._vptr_BaseResultRenderer = (_func_int **)&PTR__BaseResultRenderer_019980a0;
  LogicalType::LogicalType(&local_70.value_type,INVALID);
  local_70._vptr_BaseResultRenderer = (_func_int **)&PTR__StringResultRenderer_0199d988;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  Render(this,context,names,result,&local_70);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_50,local_50 + local_48);
  local_70._vptr_BaseResultRenderer = (_func_int **)&PTR__StringResultRenderer_0199d988;
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  local_70._vptr_BaseResultRenderer = (_func_int **)&PTR__BaseResultRenderer_019980a0;
  LogicalType::~LogicalType(&local_70.value_type);
  return __return_storage_ptr__;
}

Assistant:

string BoxRenderer::ToString(ClientContext &context, const vector<string> &names, const ColumnDataCollection &result) {
	StringResultRenderer ss;
	Render(context, names, result, ss);
	return ss.str();
}